

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void wasm::writeBase64VLQ(ostream *out,int32_t n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char local_2a;
  char local_29;
  
  uVar2 = n * -2 + 1;
  if (-1 < n) {
    uVar2 = n * 2;
  }
  uVar4 = (ulong)uVar2;
  uVar1 = uVar2 & 0x1f;
  if (0x1f < uVar2) {
    do {
      if (uVar1 < 0x14) {
        local_29 = (char)uVar1 + 'g';
      }
      else if (uVar1 < 0x1e) {
        local_29 = (char)uVar1 + '\x1c';
      }
      else {
        local_29 = (uVar1 != 0x1e) * '\x04' + '+';
      }
      uVar3 = (uint)uVar4;
      uVar4 = uVar4 >> 5;
      uVar2 = (uint)uVar4;
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_29,1);
      uVar1 = uVar2 & 0x1f;
    } while (0x3ff < uVar3);
  }
  local_2a = (char)uVar2 + 'A';
  if (0x19 < uVar1) {
    local_2a = (char)uVar2 + 'G';
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_2a,1);
  return;
}

Assistant:

static void writeBase64VLQ(std::ostream& out, int32_t n) {
  uint32_t value = n >= 0 ? n << 1 : ((-n) << 1) | 1;
  while (1) {
    uint32_t digit = value & 0x1F;
    value >>= 5;
    if (!value) {
      // last VLQ digit -- base64 codes 'A'..'Z', 'a'..'f'
      out << char(digit < 26 ? 'A' + digit : 'a' + digit - 26);
      break;
    }
    // more VLG digit will follow -- add continuation bit (0x20),
    // base64 codes 'g'..'z', '0'..'9', '+', '/'
    out << char(digit < 20
                  ? 'g' + digit
                  : digit < 30 ? '0' + digit - 20 : digit == 30 ? '+' : '/');
  }
}